

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O3

int secp256k1_fe_impl_is_square_var(secp256k1_fe *x)

{
  long lVar1;
  int iVar2;
  uint64_t a4;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint len;
  uint uVar15;
  long lVar16;
  secp256k1_modinv64_signed62 f;
  secp256k1_fe tmp;
  long local_d0;
  secp256k1_fe local_c8;
  secp256k1_modinv64_trans2x2 local_a0;
  secp256k1_modinv64_signed62 local_80;
  secp256k1_fe local_58;
  
  local_58.n[4] = x->n[4];
  local_58.n[0] = x->n[0];
  local_58.n[1] = x->n[1];
  local_58.n[2] = x->n[2];
  local_58.n[3] = x->n[3];
  secp256k1_fe_impl_normalize_var(&local_58);
  if (((local_58.n[2] == 0 && local_58.n[3] == 0) && (local_58.n[1] == 0 && local_58.n[0] == 0)) &&
      local_58.n[4] == 0) {
    iVar8 = 1;
  }
  else {
    local_80.v[0] = (local_58.n[1] << 0x34 | local_58.n[0]) & 0x3fffffffffffffff;
    local_80.v[1] = (ulong)((uint)local_58.n[2] & 0xfffff) << 0x2a | local_58.n[1] >> 10;
    local_80.v[2] = (ulong)((uint)local_58.n[3] & 0x3fffffff) << 0x20 | local_58.n[2] >> 0x14;
    local_80.v[3] = (local_58.n[4] & 0xffffffffff) << 0x16 | local_58.n[3] >> 0x1e;
    local_80.v[4] = local_58.n[4] >> 0x28;
    local_c8.n[2] = 0;
    local_c8.n[3] = 0;
    local_c8.n[0] = -0x1000003d1;
    local_c8.n[1] = 0;
    local_c8.n[4] = 0x100;
    len = 5;
    lVar16 = -1;
    iVar8 = 0;
    local_d0 = 0x4000000000000000;
    uVar15 = 0;
    do {
      lVar7 = 0;
      if ((local_80.v[0] | 0xc000000000000000U) != 0) {
        for (; ((local_80.v[0] | 0xc000000000000000U) >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      lVar16 = lVar16 - lVar7;
      uVar15 = ((uint)(local_c8.n[0] >> 1) ^ (uint)(local_c8.n[0] >> 2)) & (uint)lVar7 ^ uVar15;
      if (lVar7 == 0x3e) {
        local_a0.r = 1;
        local_a0.q = 0;
        local_a0.v = 0;
        local_a0.u = local_d0;
      }
      else {
        uVar6 = local_c8.n[1] << 0x3e | local_c8.n[0];
        local_a0.r = 1;
        local_a0.u = 1L << ((byte)lVar7 & 0x3f);
        uVar10 = (ulong)(local_80.v[1] << 0x3e | local_80.v[0]) >> ((byte)lVar7 & 0x3f);
        iVar2 = 0x3e - (uint)lVar7;
        local_a0.v = 0;
        lVar7 = 0;
        do {
          iVar9 = (int)uVar6;
          iVar12 = (int)uVar10;
          bVar4 = (byte)iVar2;
          if (lVar16 < 0) {
            lVar16 = -lVar16;
            uVar15 = uVar15 ^ (uint)((uVar6 & uVar10) >> 1);
            iVar5 = (int)lVar16 + 1;
            bVar3 = (byte)iVar5;
            if (iVar2 <= iVar5) {
              bVar3 = bVar4;
            }
            uVar11 = (uint)(0xffffffffffffffff >> (-bVar3 & 0x3f)) &
                     (iVar12 * iVar12 + 0x3e) * iVar9 * iVar12 & 0x3f;
            local_a0.q = local_a0.u;
            uVar13 = uVar6;
            uVar6 = uVar10;
            lVar14 = local_a0.r;
          }
          else {
            iVar5 = (int)lVar16 + 1;
            bVar3 = (byte)iVar5;
            if (iVar2 <= iVar5) {
              bVar3 = bVar4;
            }
            uVar11 = (uint)(0xffffffffffffffff >> (-bVar3 & 0x3f)) &
                     -(((iVar9 * 2 + 2U & 8) + iVar9) * iVar12) & 0xf;
            local_a0.q = lVar7;
            uVar13 = uVar10;
            lVar7 = local_a0.u;
            lVar14 = local_a0.v;
            local_a0.v = local_a0.r;
          }
          uVar10 = (ulong)uVar11;
          uVar13 = uVar10 * uVar6 + uVar13;
          local_a0.q = lVar7 * uVar10 + local_a0.q;
          local_a0.r = uVar10 * lVar14 + local_a0.v;
          uVar10 = -1L << (bVar4 & 0x3f) | uVar13;
          lVar1 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          bVar4 = (byte)lVar1;
          uVar10 = uVar13 >> (bVar4 & 0x3f);
          local_a0.u = lVar7 << (bVar4 & 0x3f);
          local_a0.v = lVar14 << (bVar4 & 0x3f);
          lVar16 = lVar16 - lVar1;
          uVar15 = ((uint)(uVar6 >> 1) ^ (uint)(uVar6 >> 2)) & (uint)lVar1 ^ uVar15;
          iVar2 = iVar2 - (uint)lVar1;
          lVar7 = local_a0.q;
        } while (iVar2 != 0);
      }
      secp256k1_modinv64_update_fg_62_var
                (len,(secp256k1_modinv64_signed62 *)&local_c8,&local_80,&local_a0);
      if (local_c8.n[0] == 1) {
        if ((int)len < 2) {
LAB_0012a5b7:
          return ~uVar15 & 1;
        }
        uVar6 = 1;
        uVar10 = 0;
        do {
          uVar10 = uVar10 | local_c8.n[uVar6];
          uVar6 = uVar6 + 1;
        } while (len != uVar6);
        if (uVar10 == 0) goto LAB_0012a5b7;
      }
      lVar7 = (long)(int)len;
      uVar11 = len - 1;
      if ((lVar7 + -2 < 0 || (&local_d0)[lVar7] != 0) || local_80.v[lVar7 + -1] != 0) {
        uVar11 = len;
      }
      len = uVar11;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x19);
    iVar8 = secp256k1_fe_sqrt(&local_c8,&local_58);
  }
  return iVar8;
}

Assistant:

static int secp256k1_fe_impl_is_square_var(const secp256k1_fe *x) {
    secp256k1_fe tmp;
    secp256k1_modinv64_signed62 s;
    int jac, ret;

    tmp = *x;
    secp256k1_fe_normalize_var(&tmp);
    /* secp256k1_jacobi64_maybe_var cannot deal with input 0. */
    if (secp256k1_fe_is_zero(&tmp)) return 1;
    secp256k1_fe_to_signed62(&s, &tmp);
    jac = secp256k1_jacobi64_maybe_var(&s, &secp256k1_const_modinfo_fe);
    if (jac == 0) {
        /* secp256k1_jacobi64_maybe_var failed to compute the Jacobi symbol. Fall back
         * to computing a square root. This should be extremely rare with random
         * input (except in VERIFY mode, where a lower iteration count is used). */
        secp256k1_fe dummy;
        ret = secp256k1_fe_sqrt(&dummy, &tmp);
    } else {
        ret = jac >= 0;
    }
    return ret;
}